

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.c
# Opt level: O0

void al_clear_depth_buffer(float z)

{
  uint uVar1;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_DISPLAY *pAVar2;
  float in_XMM0_Da;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_BITMAP *target;
  
  bitmap = al_get_target_bitmap();
  uVar1 = al_get_bitmap_flags(bitmap);
  if ((uVar1 & 1) == 0) {
    pAVar2 = _al_get_bitmap_display(bitmap);
    (*pAVar2->vt->clear_depth_buffer)(pAVar2,in_XMM0_Da);
  }
  return;
}

Assistant:

void al_clear_depth_buffer(float z)
{
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ASSERT(target);

   if (al_get_bitmap_flags(target) & ALLEGRO_MEMORY_BITMAP) {
      /* has no depth buffer */
   }
   else {
      ALLEGRO_DISPLAY *display = _al_get_bitmap_display(target);
      ASSERT(display);
      display->vt->clear_depth_buffer(display, z);
   }
}